

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDVertex::ReplaceEdgeInArray(ON_SubDVertex *this,ON_SubDEdge *old_edge,ON_SubDEdgePtr new_edge)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  if ((this->m_edges == (ON_SubDEdgePtr *)0x0) || (this->m_edge_count == 0)) {
    ON_SubDIncrementErrorCount();
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    if (old_edge != (ON_SubDEdge *)0x0) {
      uVar3 = EdgeArrayIndex(this,old_edge);
      if (uVar3 != 0xffffffff) {
        pOVar2 = this->m_edges;
        uVar4 = (ulong)uVar3;
        if (pOVar2[uVar4].m_ptr != new_edge.m_ptr) {
          if (new_edge.m_ptr < 8) {
            uVar1 = this->m_edge_count;
            this->m_edge_count = uVar1 - 1;
            while (uVar5 = uVar4 + 1, uVar5 < uVar1) {
              pOVar2[uVar4].m_ptr = pOVar2[uVar5].m_ptr;
              uVar4 = uVar5;
            }
            uVar6 = (uint)uVar5;
          }
          else {
            pOVar2[uVar4].m_ptr = new_edge.m_ptr;
            uVar6 = uVar3;
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

unsigned int ON_SubDVertex::ReplaceEdgeInArray(
  const ON_SubDEdge* old_edge,
  const ON_SubDEdgePtr new_edge
  )
{
  if (m_edges == nullptr || m_edge_count == 0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);
  unsigned vei = old_edge != nullptr ? EdgeArrayIndex(old_edge) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == vei || m_edges[vei].m_ptr == new_edge.m_ptr)
    return ON_UNSET_UINT_INDEX;
  if (new_edge.IsNotNull())
  {
    m_edges[vei] = new_edge;
  }
  else
  {
    const unsigned c = (unsigned)(m_edge_count--);
    while (++vei < c)
      m_edges[vei - 1] = m_edges[vei];
  }
  return vei;
}